

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderInfoLogCase::test(ShaderInfoLogCase *this)

{
  GLsizei GVar1;
  int shader_00;
  bool bVar2;
  qpTestResult qVar3;
  int *piVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  int local_1664;
  MessageBuilder local_1660;
  MessageBuilder local_14e0;
  GLsizei local_135c;
  GLchar local_1358 [4];
  GLint written_1;
  char buffer_1 [2048];
  int local_b4c;
  MessageBuilder local_b48;
  char *local_9c8;
  char *terminator;
  MessageBuilder local_9b0;
  GLsizei local_82c;
  GLchar local_828 [4];
  GLint written;
  char buffer [2048];
  undefined1 local_20 [8];
  StateQueryMemoryWriteGuard<int> logLength;
  GLuint shader;
  ShaderInfoLogCase *this_local;
  
  unique0x10000b2f = this;
  requireShaderCompiler
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper);
  logLength.m_value =
       glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    &(this->super_ApiCase).super_CallLogWrapper,logLength.m_value,0x8b84,0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value,1,
             &Functional::(anonymous_namespace)::brokenShader,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_20);
  shader_00 = logLength.m_value;
  piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_20);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,0x8b84,piVar4);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_20,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar2) {
    piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_20);
    if (*piVar4 == 0) {
      glu::CallLogWrapper::glDeleteShader
                (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value);
    }
    else {
      memset(local_828,0,0x800);
      local_828[0] = 'x';
      local_82c = 0;
      glu::CallLogWrapper::glGetShaderInfoLog
                (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value,0x800,&local_82c,
                 local_828);
      piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_20);
      GVar1 = local_82c;
      if ((*piVar4 < 0x801) &&
         (piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                             ((StateQueryMemoryWriteGuard *)local_20), GVar1 != *piVar4 + -1)) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
        tcu::TestLog::operator<<(&local_9b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_9b0,(char (*) [27])"// ERROR: Expected length ");
        piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                           ((StateQueryMemoryWriteGuard *)local_20);
        terminator._0_4_ = *piVar4 + -1;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&terminator);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b7cef6);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_82c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_9b0);
        qVar3 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar3 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got invalid log length");
        }
      }
      local_9c8 = buffer + 0x7f7;
      piVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_20);
      if (*piVar4 < 0x800) {
        local_9c8 = local_828 + local_82c;
      }
      if (*local_9c8 != '\0') {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
        tcu::TestLog::operator<<(&local_b48,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_b48,(char (*) [41])"// ERROR: Expected null terminator, got ");
        local_b4c = (int)*local_9c8;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b4c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b48);
        qVar3 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar3 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got invalid log terminator");
        }
      }
      memset(local_1358,0,0x800);
      local_1358[0] = 'x';
      local_135c = 0;
      glu::CallLogWrapper::glGetShaderInfoLog
                (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value,1,&local_135c,
                 local_1358);
      if (local_135c != 0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
        tcu::TestLog::operator<<(&local_14e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_14e0,(char (*) [34])"// ERROR: Expected length 0; got ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_135c);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_14e0);
        qVar3 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar3 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got invalid log length");
        }
      }
      if (local_1358[0] != '\0') {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
        tcu::TestLog::operator<<(&local_1660,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1660,(char (*) [41])"// ERROR: Expected null terminator, got ");
        local_1664 = (int)local_1358[0];
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1664);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1660);
        qVar3 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar3 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got invalid log terminator");
        }
      }
      glu::CallLogWrapper::glDeleteShader
                (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value);
      ApiCase::expectError(&this->super_ApiCase,0);
    }
  }
  else {
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_ApiCase).super_CallLogWrapper,logLength.m_value);
  }
  return;
}

Assistant:

void test (void)
	{
		requireShaderCompiler(m_testCtx, *this);

		using tcu::TestLog;

		// INFO_LOG_LENGTH is 0 by default and it includes null-terminator
		const GLuint shader = glCreateShader(GL_VERTEX_SHADER);
		verifyShaderParam(m_testCtx, *this, shader, GL_INFO_LOG_LENGTH, 0);

		glShaderSource(shader, 1, &brokenShader, DE_NULL);
		glCompileShader(shader);
		expectError(GL_NO_ERROR);

		// check the log length
		StateQueryMemoryWriteGuard<GLint> logLength;
		glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logLength);
		if (!logLength.verifyValidity(m_testCtx))
		{
			glDeleteShader(shader);
			return;
		}
		if (logLength == 0)
		{
			glDeleteShader(shader);
			return;
		}

		// check normal case
		{
			char buffer[2048] = {'x'}; // non-zero initialization

			GLint written = 0; // written does not include null terminator
			glGetShaderInfoLog(shader, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);

			// check lengths are consistent
			if (logLength <= DE_LENGTH_OF_ARRAY(buffer))
			{
				if (written != logLength-1)
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << logLength-1 << "; got " << written << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
				}
			}

			// check null-terminator, either at end of buffer or at buffer[written]
			const char* terminator = &buffer[DE_LENGTH_OF_ARRAY(buffer) - 1];
			if (logLength < DE_LENGTH_OF_ARRAY(buffer))
				terminator = &buffer[written];

			if (*terminator != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator, got " << (int)*terminator << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log terminator");
			}
		}

		// check with too small buffer
		{
			char buffer[2048] = {'x'}; // non-zero initialization

			// check string always ends with \0, even with small buffers
			GLint written = 0;
			glGetShaderInfoLog(shader, 1, &written, buffer);
			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			if (buffer[0] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator, got " << (int)buffer[0] << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log terminator");
			}
		}

		glDeleteShader(shader);
		expectError(GL_NO_ERROR);
	}